

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBidec.c
# Opt level: O3

void Abc_NtkBidecResyn(Abc_Ntk_t *pNtk,int fVerbose)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *vTruth;
  Hop_Obj_t *pObj;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  timespec ts;
  Bdc_Par_t local_5c;
  Bdc_Man_t *local_50;
  timespec local_48;
  long local_38;
  
  local_5c.fVeryVerbose = 0;
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBidec.c"
                  ,0x76,"void Abc_NtkBidecResyn(Abc_Ntk_t *, int)");
  }
  iVar2 = Abc_NtkToAig(pNtk);
  if (iVar2 != 0) {
    local_5c.nVarsMax = Abc_NtkGetFaninMax(pNtk);
    local_5c.fVerbose = fVerbose;
    if (0xf < local_5c.nVarsMax) {
      if (fVerbose != 0) {
        puts("Resynthesis is not performed for nodes with more than 15 inputs.");
      }
      local_5c.nVarsMax = 0xf;
    }
    local_38 = lVar5;
    vTruth = (Vec_Int_t *)calloc(1,0x10);
    local_50 = Bdc_ManAlloc(&local_5c);
    pVVar4 = pNtk->vObjs;
    if (pVVar4->nSize < 1) {
      uVar7 = 0;
    }
    else {
      lVar5 = 0;
      uVar7 = 0;
      do {
        pvVar1 = pVVar4->pArray[lVar5];
        if (((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7)) &&
           (*(int *)((long)pvVar1 + 0x1c) < 0x10)) {
          iVar2 = Hop_DagSize(*(Hop_Obj_t **)((long)pvVar1 + 0x38));
          pObj = Abc_NodeIfNodeResyn(local_50,(Hop_Man_t *)pNtk->pManFunc,
                                     *(Hop_Obj_t **)((long)pvVar1 + 0x38),
                                     *(int *)((long)pvVar1 + 0x1c),vTruth,(uint *)0x0,-1.0);
          *(Hop_Obj_t **)((long)pvVar1 + 0x38) = pObj;
          iVar3 = Hop_DagSize(pObj);
          uVar7 = (iVar2 + uVar7) - iVar3;
          pVVar4 = pNtk->vObjs;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < pVVar4->nSize);
    }
    Bdc_ManFree(local_50);
    if (vTruth->pArray != (int *)0x0) {
      free(vTruth->pArray);
    }
    free(vTruth);
    lVar5 = local_38;
    if (fVerbose != 0) {
      iVar2 = 0x97f8ef;
      printf("Total gain in AIG nodes = %d.  ",(ulong)uVar7);
      Abc_Print(iVar2,"%s =","Total runtime");
      iVar3 = 3;
      iVar2 = clock_gettime(3,&local_48);
      if (iVar2 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
      }
      Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
    }
  }
  return;
}

Assistant:

void Abc_NtkBidecResyn( Abc_Ntk_t * pNtk, int fVerbose )
{
    Bdc_Par_t Pars = {0}, * pPars = &Pars;
    Bdc_Man_t * p;
    Abc_Obj_t * pObj;
    Vec_Int_t * vTruth;
    int i, nGainTotal = 0, nNodes1, nNodes2;
    abctime clk = Abc_Clock();
    assert( Abc_NtkIsLogic(pNtk) );
    if ( !Abc_NtkToAig(pNtk) )
        return;
    pPars->nVarsMax = Abc_NtkGetFaninMax( pNtk );
    pPars->fVerbose = fVerbose;
    if ( pPars->nVarsMax > 15 )
    {
        if ( fVerbose )
        printf( "Resynthesis is not performed for nodes with more than 15 inputs.\n" );
        pPars->nVarsMax = 15;
    }
    vTruth = Vec_IntAlloc( 0 );
    p = Bdc_ManAlloc( pPars );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj) > 15 )
            continue;
        nNodes1 = Hop_DagSize((Hop_Obj_t *)pObj->pData);
        pObj->pData = Abc_NodeIfNodeResyn( p, (Hop_Man_t *)pNtk->pManFunc, (Hop_Obj_t *)pObj->pData, Abc_ObjFaninNum(pObj), vTruth, NULL, -1.0 );
        nNodes2 = Hop_DagSize((Hop_Obj_t *)pObj->pData);
        nGainTotal += nNodes1 - nNodes2;
    }
    Bdc_ManFree( p );
    Vec_IntFree( vTruth );
    if ( fVerbose )
    {
    printf( "Total gain in AIG nodes = %d.  ", nGainTotal );
    ABC_PRT( "Total runtime", Abc_Clock() - clk );
    }
}